

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O3

void InitUndistortRectifyMap(Mat *K,Mat *D,Mat *xi,Mat *R,Mat *P,Size *size,Mat *map1,Mat *map2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double *pdVar12;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  int iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Mat KRi;
  Size local_480;
  Size local_478;
  Mat local_470 [96];
  Mat local_410 [16];
  long local_400;
  long *local_3c8;
  Mat local_3b0 [16];
  long local_3a0;
  long *local_368;
  long *local_350 [2];
  Mat local_340 [96];
  Mat local_2e0 [96];
  Mat aMStack_280 [144];
  Mat local_1f0 [16];
  double *local_1e0;
  Mat local_190 [16];
  Mat local_180 [96];
  Mat local_120 [96];
  Mat aMStack_c0 [144];
  
  local_478 = *size;
  cv::Mat::Mat((Mat *)local_350,&local_478,5);
  cv::Mat::operator=(map1,(Mat *)local_350);
  cv::Mat::~Mat((Mat *)local_350);
  local_480 = *size;
  cv::Mat::Mat((Mat *)local_350,&local_480,5);
  cv::Mat::operator=(map2,(Mat *)local_350);
  cv::Mat::~Mat((Mat *)local_350);
  pdVar12 = *(double **)(K + 0x10);
  dVar1 = *pdVar12;
  dVar2 = pdVar12[1];
  dVar3 = *(double *)((long)pdVar12 + **(long **)(K + 0x48) + 8);
  dVar4 = *(double *)((long)pdVar12 + **(long **)(K + 0x48) + 0x10);
  dVar5 = pdVar12[2];
  dVar6 = **(double **)(xi + 0x10);
  pdVar12 = *(double **)(D + 0x10);
  dVar7 = *pdVar12;
  dVar8 = pdVar12[1];
  dVar9 = pdVar12[2];
  dVar10 = pdVar12[3];
  cv::operator*(local_190,P);
  cv::MatExpr::inv((int)local_350);
  cv::Mat::Mat(local_470);
  (**(code **)(*local_350[0] + 0x18))(local_350[0],local_350,local_470,0xffffffff);
  cv::Mat::~Mat(aMStack_280);
  cv::Mat::~Mat(local_2e0);
  cv::Mat::~Mat(local_340);
  cv::Mat::~Mat(aMStack_c0);
  cv::Mat::~Mat(local_120);
  cv::Mat::~Mat(local_180);
  iVar16 = size->height;
  if (0 < iVar16) {
    uVar17 = (ulong)(uint)size->width;
    lVar18 = 0;
    do {
      if (0 < (int)uVar17) {
        dVar14 = (double)(int)lVar18;
        lVar19 = 0;
        do {
          cv::Mat::Mat(local_1f0,local_470);
          dVar23 = (double)(int)lVar19;
          dVar20 = *local_1e0 * dVar23 + local_1e0[1] * dVar14 + local_1e0[2];
          cv::Mat::~Mat(local_1f0);
          cv::Mat::Mat(local_3b0,local_470);
          lVar13 = *local_368;
          dVar11 = *(double *)(local_3a0 + lVar13);
          dVar21 = *(double *)(local_3a0 + 8 + lVar13);
          dVar22 = *(double *)(local_3a0 + 0x10 + lVar13);
          cv::Mat::~Mat(local_3b0);
          cv::Mat::Mat(local_410,local_470);
          dVar22 = dVar22 + dVar11 * dVar23 + dVar21 * dVar14;
          lVar13 = *local_3c8;
          dVar21 = dVar23 * *(double *)(local_400 + lVar13 * 2) +
                   *(double *)(local_400 + 8 + lVar13 * 2) * dVar14 +
                   *(double *)(local_400 + 0x10 + lVar13 * 2);
          cv::Mat::~Mat(local_410);
          auVar24._8_8_ = dVar20;
          auVar24._0_8_ = dVar22;
          dVar11 = SQRT(dVar21 * dVar21 + dVar20 * dVar20 + dVar22 * dVar22);
          dVar21 = dVar21 / dVar11 + dVar6;
          auVar25._8_4_ = SUB84(dVar11,0);
          auVar25._0_8_ = dVar11;
          auVar25._12_4_ = (int)((ulong)dVar11 >> 0x20);
          auVar25 = divpd(auVar24,auVar25);
          auVar15._8_8_ = dVar21;
          auVar15._0_8_ = dVar21;
          auVar25 = divpd(auVar25,auVar15);
          dVar23 = auVar25._0_8_;
          dVar20 = auVar25._8_8_;
          dVar21 = dVar20 * dVar20 + dVar23 * dVar23;
          dVar11 = dVar7 * dVar21 + 1.0 + dVar21 * dVar21 * dVar8;
          dVar22 = ((dVar23 + dVar23) * dVar23 + dVar21) * dVar9 +
                   dVar11 * dVar23 + dVar20 * (dVar10 + dVar10) * dVar23;
          *(float *)(**(long **)(map1 + 0x48) * lVar18 + *(long *)(map1 + 0x10) + lVar19 * 4) =
               (float)(dVar2 * dVar22 +
                       (((dVar20 + dVar20) * dVar20 + dVar21) * dVar10 +
                       dVar11 * dVar20 + (dVar9 + dVar9) * dVar20 * dVar23) * dVar1 + dVar5);
          *(float *)(**(long **)(map2 + 0x48) * lVar18 + *(long *)(map2 + 0x10) + lVar19 * 4) =
               (float)(dVar22 * dVar3 + dVar4);
          lVar19 = lVar19 + 1;
          uVar17 = (ulong)size->width;
        } while (lVar19 < (long)uVar17);
        iVar16 = size->height;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar16);
  }
  cv::Mat::~Mat(local_470);
  return;
}

Assistant:

void InitUndistortRectifyMap(cv::Mat K, cv::Mat D, cv::Mat xi, cv::Mat R,
                             cv::Mat P, cv::Size size,
                             cv::Mat& map1, cv::Mat& map2) {
  map1 = cv::Mat(size, CV_32F);
  map2 = cv::Mat(size, CV_32F);

  double fx = K.at<double>(0,0);
  double fy = K.at<double>(1,1);
  double cx = K.at<double>(0,2);
  double cy = K.at<double>(1,2);
  double s  = K.at<double>(0,1);

  double xid = xi.at<double>(0,0);

  double k1 = D.at<double>(0,0);
  double k2 = D.at<double>(0,1);
  double p1 = D.at<double>(0,2);
  double p2 = D.at<double>(0,3);

  cv::Mat KRi = (P * R).inv();

  for (int r = 0; r < size.height; ++r) {
    for (int c = 0; c < size.width; ++c) {
      double xc = MatRowMul(KRi, c, r, 1., 0);
      double yc = MatRowMul(KRi, c, r, 1., 1);
      double zc = MatRowMul(KRi, c, r, 1., 2);

      double rr = sqrt(xc * xc + yc * yc + zc * zc);
      double xs = xc / rr;
      double ys = yc / rr;
      double zs = zc / rr;

      double xu = xs / (zs + xid);
      double yu = ys / (zs + xid);

      double r2 = xu * xu + yu * yu;
      double r4 = r2 * r2;
      double xd = (1+k1*r2+k2*r4)*xu + 2*p1*xu*yu + p2*(r2+2*xu*xu);
      double yd = (1+k1*r2+k2*r4)*yu + 2*p2*xu*yu + p1*(r2+2*yu*yu);

      double u = fx * xd + s * yd + cx;
      double v = fy * yd + cy;

      map1.at<float>(r,c) = (float) u;
      map2.at<float>(r,c) = (float) v;
    }
  }
}